

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable-file-dialogs.h
# Opt level: O1

void __thiscall pfd::settings::settings(settings *this,bool resync)

{
  pointer psVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  undefined1 *puVar7;
  string desktop_name;
  string pfd_verbose;
  regex match_no;
  undefined1 local_b8 [40];
  char *local_90;
  pointer local_88;
  char local_80 [16];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  long local_68;
  char local_60 [16];
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  flags(pfd::settings::flag)::flags._0_1_ = !resync & (byte)flags(pfd::settings::flag)::flags;
  if ((byte)flags(pfd::settings::flag)::flags != 0) {
    return;
  }
  psVar1 = (pointer)(local_b8 + 0x10);
  local_b8._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PFD_VERBOSE","");
  pcVar4 = getenv((char *)local_b8._0_8_);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "";
  }
  local_70._M_current = local_60;
  sVar5 = strlen(pcVar4);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar4,pcVar4 + sVar5);
  if ((pointer)local_b8._0_8_ != psVar1) {
    operator_delete((void *)local_b8._0_8_);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_50,"(|0|no|false)",1);
  local_b8._16_8_ = (pointer)0x0;
  local_b8._24_8_ = (char *)0x0;
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = (pointer)0x0;
  bVar2 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (local_70,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )(local_70._M_current + local_68),
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_b8,&local_50,0);
  if ((pointer)local_b8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_b8._0_8_);
  }
  if (!bVar2) {
    flags(pfd::settings::flag)::flags._1_1_ = 1;
  }
  local_b8._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"zenity","");
  flags(pfd::settings::flag)::flags._2_1_ = check_program(this,(string *)local_b8);
  if ((pointer)local_b8._0_8_ != psVar1) {
    operator_delete((void *)local_b8._0_8_);
  }
  local_b8._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"matedialog","");
  flags(pfd::settings::flag)::flags._3_1_ = check_program(this,(string *)local_b8);
  if ((pointer)local_b8._0_8_ != psVar1) {
    operator_delete((void *)local_b8._0_8_);
  }
  local_b8._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"qarma","");
  flags(pfd::settings::flag)::flags._4_1_ = check_program(this,(string *)local_b8);
  if ((pointer)local_b8._0_8_ != psVar1) {
    operator_delete((void *)local_b8._0_8_);
  }
  local_b8._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"kdialog","");
  flags(pfd::settings::flag)::flags._5_1_ = check_program(this,(string *)local_b8);
  if ((pointer)local_b8._0_8_ != psVar1) {
    operator_delete((void *)local_b8._0_8_);
  }
  if ((flags(pfd::settings::flag)::flags._2_1_ != '\x01') ||
     (flags(pfd::settings::flag)::flags._5_1_ != '\x01')) goto LAB_0012919e;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"XDG_SESSION_DESKTOP","");
  pcVar6 = getenv(local_90);
  pcVar4 = "";
  if (pcVar6 != (char *)0x0) {
    pcVar4 = pcVar6;
  }
  local_b8._0_8_ = psVar1;
  sVar5 = strlen(pcVar4);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,pcVar4,pcVar4 + sVar5);
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"gnome","");
  if ((pointer)local_b8._8_8_ == local_88) {
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      bVar2 = true;
    }
    else {
      iVar3 = bcmp((void *)local_b8._0_8_,local_90,local_b8._8_8_);
      bVar2 = iVar3 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (bVar2) {
    puVar7 = (undefined1 *)((long)&flags(pfd::settings::flag)::flags + 5);
LAB_0012918d:
    *puVar7 = 0;
  }
  else {
    local_90 = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"KDE","");
    if ((pointer)local_b8._8_8_ == local_88) {
      if ((pointer)local_b8._8_8_ == (pointer)0x0) {
        bVar2 = true;
      }
      else {
        iVar3 = bcmp((void *)local_b8._0_8_,local_90,local_b8._8_8_);
        bVar2 = iVar3 == 0;
      }
    }
    else {
      bVar2 = false;
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    if (bVar2) {
      puVar7 = (undefined1 *)((long)&flags(pfd::settings::flag)::flags + 2);
      goto LAB_0012918d;
    }
  }
  if ((pointer)local_b8._0_8_ != psVar1) {
    operator_delete((void *)local_b8._0_8_);
  }
LAB_0012919e:
  flags(pfd::settings::flag)::flags._0_1_ = 1;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
  if (local_70._M_current != local_60) {
    operator_delete(local_70._M_current);
  }
  return;
}

Assistant:

inline settings::settings(bool resync)
{
    flags(flag::is_scanned) &= !resync;

    if (flags(flag::is_scanned))
        return;

    auto pfd_verbose = internal::getenv("PFD_VERBOSE");
    auto match_no = std::regex("(|0|no|false)", std::regex_constants::icase);
    if (!std::regex_match(pfd_verbose, match_no))
        flags(flag::is_verbose) = true;

#if _WIN32
    flags(flag::is_vista) = internal::is_vista();
#elif !__APPLE__
    flags(flag::has_zenity) = check_program("zenity");
    flags(flag::has_matedialog) = check_program("matedialog");
    flags(flag::has_qarma) = check_program("qarma");
    flags(flag::has_kdialog) = check_program("kdialog");

    // If multiple helpers are available, try to default to the best one
    if (flags(flag::has_zenity) && flags(flag::has_kdialog))
    {
        auto desktop_name = internal::getenv("XDG_SESSION_DESKTOP");
        if (desktop_name == std::string("gnome"))
            flags(flag::has_kdialog) = false;
        else if (desktop_name == std::string("KDE"))
            flags(flag::has_zenity) = false;
    }
#endif

    flags(flag::is_scanned) = true;
}